

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execNegEa<(moira::Instr)84,(moira::Mode)2,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint uVar2;
  u32 uVar3;
  ulong uVar4;
  u32 data;
  u32 ea;
  uint local_20;
  u32 local_1c;
  
  bVar1 = readOp<(moira::Mode)2,(moira::Size)4,0ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar1) {
    uVar4 = -((ulong)(this->reg).sr.x + (ulong)local_20);
    bVar1 = (bool)((byte)(uVar4 >> 0x20) & 1);
    (this->reg).sr.c = bVar1;
    (this->reg).sr.x = bVar1;
    uVar2 = (uint)uVar4;
    (this->reg).sr.v = (int)(uVar2 & local_20) < 0;
    if (uVar2 != 0) {
      (this->reg).sr.z = false;
    }
    (this->reg).sr.n = (bool)((byte)(uVar4 >> 0x1f) & 1);
    uVar3 = (this->reg).pc;
    (this->reg).pc0 = uVar3;
    (this->queue).ird = (this->queue).irc;
    local_20 = uVar2;
    uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar3 + 2);
    uVar2 = local_20;
    (this->queue).irc = (u16)uVar3;
    writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,local_1c,local_20 >> 0x10);
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,local_1c + 2,uVar2 & 0xffff);
  }
  return;
}

Assistant:

void
Moira::execNegEa(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,S,STD_AE_FRAME>(dst, ea, data)) return;
    
    data = logic<I,S>(data);
    prefetch();

    writeOp<M,S,POLLIPL>(dst, ea, data);
}